

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<256U,_unsigned_short,_void,_false> * __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator|=
          (uintwide_t<256U,_unsigned_short,_void,_false> *this,
          uintwide_t<256U,_unsigned_short,_void,_false> *other)

{
  iterator puVar1;
  ushort *local_28;
  iterator itr_a;
  const_iterator itr_b;
  uintwide_t<256U,_unsigned_short,_void,_false> *other_local;
  uintwide_t<256U,_unsigned_short,_void,_false> *this_local;
  
  if (this != other) {
    itr_a = detail::array_detail::array<unsigned_short,_16UL>::cbegin
                      ((array<unsigned_short,_16UL> *)other);
    for (local_28 = detail::array_detail::array<unsigned_short,_16UL>::begin
                              ((array<unsigned_short,_16UL> *)this);
        puVar1 = detail::array_detail::array<unsigned_short,_16UL>::end
                           ((array<unsigned_short,_16UL> *)this), local_28 != puVar1;
        local_28 = local_28 + 1) {
      *local_28 = *local_28 | *itr_a;
      itr_a = itr_a + 1;
    }
  }
  return this;
}

Assistant:

constexpr auto operator|=(const uintwide_t& other) -> uintwide_t& // LCOV_EXCL_LINE
    {
      if(this != &other) // LCOV_EXCL_LINE
      {
        auto itr_b = other.values.cbegin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        // Perform bitwise OR.
        for(auto itr_a = values.begin(); itr_a != values.end(); ++itr_a, ++itr_b) // NOLINT(altera-id-dependent-backward-branch,llvm-qualified-auto,readability-qualified-auto)
        {
          *itr_a = static_cast<limb_type>(*itr_a | *itr_b);
        }
      }

      return *this; // LCOV_EXCL_LINE
    }